

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_bool32 ma_dr_mp3_seek_to_pcm_frame(ma_dr_mp3 *pMP3,ma_uint64 frameIndex)

{
  ulong *puVar1;
  ma_dr_mp3_seek_proc p_Var2;
  ma_dr_mp3_seek_point *pmVar3;
  ma_bool32 mVar4;
  ma_uint32 mVar5;
  ma_uint64 mVar6;
  ma_bool32 mVar7;
  uint uVar8;
  ma_uint8 *pPCMFrames;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  ma_uint64 mVar13;
  ulong uVar14;
  ulong local_38;
  
  if ((pMP3 == (ma_dr_mp3 *)0x0) || (p_Var2 = pMP3->onSeek, p_Var2 == (ma_dr_mp3_seek_proc)0x0)) {
LAB_0014dfc0:
    mVar7 = 0;
  }
  else if (frameIndex == 0) {
    mVar7 = 0;
    mVar4 = (*p_Var2)(pMP3->pUserData,0,ma_dr_mp3_seek_origin_start);
    if (mVar4 != 0) {
      pMP3->pcmFramesConsumedInMP3Frame = 0;
      pMP3->pcmFramesRemainingInMP3Frame = 0;
      pMP3->dataSize = 0;
      pMP3->currentPCMFrame = 0;
      pMP3->streamCursor = 0;
      pMP3->field_0x3ea0 = pMP3->field_0x3ea0 & 0xfe;
      (pMP3->decoder).header[0] = '\0';
      mVar7 = 1;
    }
  }
  else {
    pmVar3 = pMP3->pSeekPoints;
    if ((pmVar3 == (ma_dr_mp3_seek_point *)0x0) || (pMP3->seekPointCount == 0)) {
      if (pMP3->currentPCMFrame == frameIndex) {
        return 1;
      }
      if (frameIndex < pMP3->currentPCMFrame) {
        mVar4 = (*p_Var2)(pMP3->pUserData,0,ma_dr_mp3_seek_origin_start);
        if (mVar4 == 0) {
          return 0;
        }
        pMP3->pcmFramesConsumedInMP3Frame = 0;
        pMP3->pcmFramesRemainingInMP3Frame = 0;
        pMP3->dataSize = 0;
        pMP3->currentPCMFrame = 0;
        pMP3->streamCursor = 0;
        pMP3->field_0x3ea0 = pMP3->field_0x3ea0 & 0xfe;
        (pMP3->decoder).header[0] = '\0';
      }
      mVar13 = pMP3->currentPCMFrame;
    }
    else {
      uVar12 = 0;
      if (frameIndex < pmVar3->pcmFrameIndex) {
        uVar14 = 0;
      }
      else {
        uVar8 = pMP3->seekPointCount - 1;
        uVar9 = 0xffffffff;
        lVar11 = 0;
        do {
          uVar10 = uVar8;
          if ((ulong)uVar8 * 0x18 == lVar11) break;
          uVar9 = uVar9 + 1;
          puVar1 = (ulong *)((long)&pmVar3[1].pcmFrameIndex + lVar11);
          lVar11 = lVar11 + 0x18;
          uVar10 = uVar9;
        } while (*puVar1 <= frameIndex);
        uVar14 = (ulong)uVar10;
      }
      if (frameIndex < pmVar3->pcmFrameIndex) {
        mVar13 = 0;
        mVar6 = 0;
        local_38 = 0;
      }
      else {
        mVar6 = pmVar3[uVar14].seekPosInBytes;
        mVar13 = pmVar3[uVar14].pcmFrameIndex;
        uVar12 = (uint)pmVar3[uVar14].mp3FramesToDiscard;
        local_38 = (ulong)pmVar3[uVar14].pcmFramesToDiscard;
      }
      if (mVar6 < 0x80000000) {
        mVar4 = (*p_Var2)(pMP3->pUserData,(int)mVar6,ma_dr_mp3_seek_origin_start);
        if (mVar4 == 0) {
          return 0;
        }
        pMP3->streamCursor = mVar6;
      }
      else {
        mVar4 = (*p_Var2)(pMP3->pUserData,0x7fffffff,ma_dr_mp3_seek_origin_start);
        if (mVar4 == 0) {
          return 0;
        }
        pMP3->streamCursor = 0x7fffffff;
        uVar14 = mVar6 - 0x7fffffff;
        while (uVar14 != 0) {
          if (uVar14 < 0x80000000) {
            mVar4 = (*pMP3->onSeek)(pMP3->pUserData,(int)uVar14,ma_dr_mp3_seek_origin_current);
            if (mVar4 == 0) goto LAB_0014dfc0;
            pMP3->streamCursor = pMP3->streamCursor + uVar14;
            uVar14 = 0;
          }
          else {
            mVar4 = (*pMP3->onSeek)(pMP3->pUserData,0x7fffffff,ma_dr_mp3_seek_origin_current);
            if (mVar4 == 0) goto LAB_0014dfc0;
            pMP3->streamCursor = pMP3->streamCursor + 0x7fffffff;
            uVar14 = uVar14 - 0x7fffffff;
          }
        }
      }
      pMP3->pcmFramesConsumedInMP3Frame = 0;
      pMP3->pcmFramesRemainingInMP3Frame = 0;
      pMP3->currentPCMFrame = 0;
      pMP3->dataSize = 0;
      pMP3->field_0x3ea0 = pMP3->field_0x3ea0 & 0xfe;
      (pMP3->decoder).header[0] = '\0';
      if (uVar12 != 0) {
        do {
          pPCMFrames = (ma_uint8 *)0x0;
          if (uVar12 == 1) {
            pPCMFrames = pMP3->pcmFrames;
          }
          mVar5 = ma_dr_mp3_decode_next_frame_ex(pMP3,(ma_dr_mp3d_sample_t *)pPCMFrames);
          if (mVar5 == 0) {
            return 0;
          }
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
      }
      mVar13 = mVar13 - local_38;
      pMP3->currentPCMFrame = mVar13;
    }
    if (pMP3->onRead == (ma_dr_mp3_read_proc)0x0) {
      mVar6 = 0;
    }
    else {
      mVar6 = ma_dr_mp3_read_pcm_frames_raw(pMP3,frameIndex - mVar13,(void *)0x0);
    }
    mVar7 = (ma_bool32)(mVar6 == frameIndex - mVar13);
  }
  return mVar7;
}

Assistant:

MA_API ma_bool32 ma_dr_mp3_seek_to_pcm_frame(ma_dr_mp3* pMP3, ma_uint64 frameIndex)
{
    if (pMP3 == NULL || pMP3->onSeek == NULL) {
        return MA_FALSE;
    }
    if (frameIndex == 0) {
        return ma_dr_mp3_seek_to_start_of_stream(pMP3);
    }
    if (pMP3->pSeekPoints != NULL && pMP3->seekPointCount > 0) {
        return ma_dr_mp3_seek_to_pcm_frame__seek_table(pMP3, frameIndex);
    } else {
        return ma_dr_mp3_seek_to_pcm_frame__brute_force(pMP3, frameIndex);
    }
}